

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

bool tinyusdz::value::Lerp(Value *a,Value *b,double dt,Value *dst)

{
  vtable_type *pvVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  half hVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  half2 hVar8;
  texcoord2h tVar9;
  half3 hVar10;
  point3h pVar11;
  vector3h vVar12;
  color3h cVar13;
  normal3h nVar14;
  texcoord3h tVar15;
  half *a_00;
  half *b_00;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *a_01;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *b_01;
  point3d *ppVar16;
  point3d *ppVar17;
  vector3f *a_02;
  vector3f *b_02;
  texcoord2f *ptVar18;
  texcoord2f *ptVar19;
  array<double,_2UL> *paVar20;
  array<double,_2UL> *paVar21;
  quatf *a_03;
  quatf *b_03;
  color4f *a_04;
  color4f *b_04;
  vector3d *pvVar22;
  vector3d *pvVar23;
  array<tinyusdz::value::half,_4UL> *a_05;
  array<tinyusdz::value::half,_4UL> *b_05;
  half4 hVar24;
  normal3d *pnVar25;
  normal3d *pnVar26;
  array<float,_2UL> *paVar27;
  array<float,_2UL> *paVar28;
  array<double,_3UL> *paVar29;
  array<double,_3UL> *paVar30;
  quath *this;
  quath *a_06;
  quath qVar31;
  float *pfVar32;
  float *pfVar33;
  double *pdVar34;
  double *pdVar35;
  tinyusdz *ptVar36;
  array<double,_4UL> *a_07;
  array<tinyusdz::value::half,_2UL> *a_08;
  array<tinyusdz::value::half,_2UL> *b_06;
  array<tinyusdz::value::half,_3UL> *a_09;
  array<tinyusdz::value::half,_3UL> *b_07;
  normal3f *a_10;
  normal3f *b_08;
  texcoord2h *a_11;
  texcoord2h *b_09;
  array<float,_4UL> *a_12;
  array<float,_4UL> *b_10;
  point3h *a_13;
  point3h *b_11;
  point3f *a_14;
  point3f *b_12;
  array<float,_3UL> *a_15;
  array<float,_3UL> *b_13;
  quatd *a_16;
  quatd *b_14;
  color3d *pcVar37;
  color3d *pcVar38;
  vector3h *a_17;
  vector3h *b_15;
  color4d *a_18;
  color4d *b_16;
  color4h *a_19;
  color4h *b_17;
  color4h cVar39;
  color3h *a_20;
  color3h *b_18;
  color3f *a_21;
  color3f *b_19;
  normal3h *a_22;
  normal3h *b_20;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *a_23;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *b_21;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *a_24;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *b_22;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *a_25;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *b_23;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *a_26;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *b_24;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *a_27;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *a_28;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *b_25;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *a_29;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *b_26;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *a_30;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *b_27;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *a_31;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *a_32;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *b_28;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *a_33;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a_34;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *a_35;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *b_29;
  vector<float,_std::allocator<float>_> *a_36;
  vector<float,_std::allocator<float>_> *b_30;
  vector<double,_std::allocator<double>_> *a_37;
  vector<double,_std::allocator<double>_> *b_31;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *a_38;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *a_39;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *a_40;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *a_41;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *b_32;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *a_42;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *b_33;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *a_43;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *a_44;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *b_34;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *a_45;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *b_35;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *a_46;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *a_47;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *b_36;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *a_48;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *b_37;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *a_49;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *b_38;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *a_50;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *b_39;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *a_51;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *b_40;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *a_52;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *b_41;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *a_53;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *b_42;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *a_54;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *b_43;
  texcoord2d *ptVar40;
  texcoord2d *ptVar41;
  texcoord3f *a_55;
  texcoord3f *b_44;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *a_56;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *b_45;
  texcoord3d *ptVar42;
  texcoord3d *ptVar43;
  texcoord3h *a_57;
  texcoord3h *b_46;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *a_58;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *b_47;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *a_59;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *b_48;
  long lVar44;
  undefined8 extraout_RDX;
  vector3f vVar45;
  normal3f nVar46;
  point3f pVar47;
  float3 fVar48;
  color3f cVar49;
  texcoord3f tVar50;
  texcoord2f c;
  undefined1 local_88 [16];
  vtable_type *local_78;
  storage_union local_60;
  undefined8 *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  if (dst == (Value *)0x0) {
    return false;
  }
  pvVar1 = (a->v_).vtable;
  uVar7 = 2;
  uVar6 = 2;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar6 = (*pvVar1->type_id)();
  }
  pvVar1 = (b->v_).vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar7 = (*pvVar1->type_id)();
  }
  if (uVar6 != uVar7) {
    return false;
  }
  pvVar1 = (a->v_).vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    uVar6 = 2;
  }
  else {
    uVar6 = (*pvVar1->type_id)();
  }
  bVar4 = IsLerpSupportedType(uVar6);
  if (!bVar4) {
    return false;
  }
  local_50 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_60.dynamic = (void *)0x0;
  if (0x3c < uVar6 - 0xe) {
    if (uVar6 - 0x10000e < 0x3d) {
      lVar44 = (long)&switchD_002a1492::switchdataD_003aaf3c +
               (long)(int)(&switchD_002a1492::switchdataD_003aaf3c)[uVar6 - 0x10000e];
      switch(uVar6) {
      case 0x10000e:
        a_01 = Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                         (a,false);
        b_01 = Value::as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                         (b,false);
        if (b_01 == (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0 ||
            a_01 == (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)0x0)
        break;
        lerp<tinyusdz::value::half>
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &local_48,a_01,b_01,dt);
        local_88._8_8_ =
             local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_88._0_8_ =
             local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_78 = (vtable_type *)
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        linb::any::operator=
                  ((any *)&local_60,
                   (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_88
                  );
        goto LAB_002a2e18;
      default:
        goto LAB_002a2e42;
      case 0x100011:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                            (a,false);
        a_39 = Value::
               as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                         (b,false);
        if (a_39 != (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     *)0x0 && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<tinyusdz::value::half,2ul>>
                    ((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      *)&local_48,ptVar36,a_39,
                     (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      *)CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100012:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                            (a,false);
        a_40 = Value::
               as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                         (b,false);
        if (a_40 != (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *)0x0 && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<tinyusdz::value::half,3ul>>
                    ((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)&local_48,ptVar36,a_40,
                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100013:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                            (a,false);
        a_31 = Value::
               as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                         (b,false);
        if (a_31 != (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     *)0x0 && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<tinyusdz::value::half,4ul>>
                    ((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)&local_48,ptVar36,a_31,
                     (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100028:
        a_36 = Value::as<std::vector<float,std::allocator<float>>>(a,false);
        b_30 = Value::as<std::vector<float,std::allocator<float>>>(b,false);
        if (b_30 != (vector<float,_std::allocator<float>_> *)0x0 &&
            a_36 != (vector<float,_std::allocator<float>_> *)0x0) {
          lerp<float>((vector<float,_std::allocator<float>_> *)&local_48,a_36,b_30,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=((any *)&local_60,(vector<float,_std::allocator<float>_> *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100029:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                            (a,false);
        a_33 = Value::as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                         (b,false);
        if (a_33 != (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x0
            && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<float,2ul>>
                    ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     &local_48,ptVar36,a_33,
                     (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10002a:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                            (a,false);
        a_46 = Value::as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                         (b,false);
        if (a_46 != (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0
            && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<float,3ul>>
                    ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &local_48,ptVar36,a_46,
                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10002b:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                            (a,false);
        a_43 = Value::as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                         (b,false);
        if (a_43 != (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0
            && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<float,4ul>>
                    ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     &local_48,ptVar36,a_43,
                     (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10002c:
        a_37 = Value::as<std::vector<double,std::allocator<double>>>(a,false);
        b_31 = Value::as<std::vector<double,std::allocator<double>>>(b,false);
        if (b_31 != (vector<double,_std::allocator<double>_> *)0x0 &&
            a_37 != (vector<double,_std::allocator<double>_> *)0x0) {
          lerp<double>(&local_48,a_37,b_31,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=((any *)&local_60,(vector<double,_std::allocator<double>_> *)local_88)
          ;
          goto LAB_002a2e18;
        }
        break;
      case 0x10002d:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                            (a,false);
        a_27 = Value::as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                         (b,false);
        if (a_27 != (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                    0x0 && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<double,2ul>>
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &local_48,ptVar36,a_27,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10002e:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                            (a,false);
        a_34 = Value::as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                         (b,false);
        if (a_34 != (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                    0x0 && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<double,3ul>>
                    ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     &local_48,ptVar36,a_34,
                     (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10002f:
        ptVar36 = (tinyusdz *)
                  Value::
                  as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                            (a,false);
        a_38 = Value::as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                         (b,false);
        if (a_38 != (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                    0x0 && ptVar36 != (tinyusdz *)0x0) {
          lerp<std::array<double,4ul>>
                    ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     &local_48,ptVar36,a_38,
                     (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100030:
        a_35 = Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                         (a,false);
        b_29 = Value::as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                         (b,false);
        if (b_29 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)0x0
            && a_35 != (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                       0x0) {
          lerp<tinyusdz::value::quath>
                    ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                     &local_48,a_35,b_29,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100031:
        a_28 = Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                         (a,false);
        b_25 = Value::as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                         (b,false);
        if (b_25 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0
            && a_28 != (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       0x0) {
          lerp<tinyusdz::value::quatf>
                    ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                     &local_48,a_28,b_25,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100032:
        a_47 = Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                         (a,false);
        b_36 = Value::as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                         (b,false);
        if (b_36 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)0x0
            && a_47 != (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                       0x0) {
          lerp<tinyusdz::value::quatd>
                    ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                     &local_48,a_47,b_36,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100039:
        a_52 = Value::
               as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                         (a,false);
        b_41 = Value::
               as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                         (b,false);
        if (b_41 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                    0x0 &&
            a_52 != (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                    0x0) {
          lerp<tinyusdz::value::color3h>
                    ((vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                     &local_48,a_52,b_41,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10003a:
        a_53 = Value::
               as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                         (a,false);
        b_42 = Value::
               as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                         (b,false);
        if (b_42 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                    0x0 &&
            a_53 != (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                    0x0) {
          lerp<tinyusdz::value::color3f>
                    ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     &local_48,a_53,b_42,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10003b:
        a_48 = Value::
               as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                         (a,false);
        b_37 = Value::
               as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                         (b,false);
        if (b_37 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                    0x0 &&
            a_48 != (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                    0x0) {
          lerp<tinyusdz::value::color3d>
                    ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     &local_48,a_48,b_37,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10003c:
        a_51 = Value::
               as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                         (a,false);
        b_40 = Value::
               as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                         (b,false);
        if (b_40 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                    0x0 &&
            a_51 != (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                    0x0) {
          lerp<tinyusdz::value::color4h>
                    ((vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                     &local_48,a_51,b_40,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10003d:
        a_29 = Value::
               as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                         (a,false);
        b_26 = Value::
               as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                         (b,false);
        if (b_26 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                    0x0 &&
            a_29 != (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                    0x0) {
          lerp<tinyusdz::value::color4f>
                    ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     &local_48,a_29,b_26,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10003e:
        a_50 = Value::
               as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                         (a,false);
        b_39 = Value::
               as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                         (b,false);
        if (b_39 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                    0x0 &&
            a_50 != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                    0x0) {
          lerp<tinyusdz::value::color4d>
                    ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     &local_48,a_50,b_39,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10003f:
        a_44 = Value::
               as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                         (a,false);
        b_34 = Value::
               as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                         (b,false);
        if (b_34 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                    0x0 &&
            a_44 != (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                    0x0) {
          lerp<tinyusdz::value::point3h>
                    ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     &local_48,a_44,b_34,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100040:
        a_45 = Value::
               as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                         (a,false);
        b_35 = Value::
               as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                         (b,false);
        if (b_35 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                    0x0 &&
            a_45 != (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                    0x0) {
          lerp<tinyusdz::value::point3f>
                    ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     &local_48,a_45,b_35,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100041:
        a_24 = Value::
               as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                         (a,false);
        b_22 = Value::
               as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                         (b,false);
        if (b_22 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                    0x0 &&
            a_24 != (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                    0x0) {
          lerp<tinyusdz::value::point3d>
                    ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     &local_48,a_24,b_22,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100042:
        a_54 = Value::
               as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                         (a,false);
        b_43 = Value::
               as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                         (b,false);
        if (b_43 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *
                    )0x0 &&
            a_54 != (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *
                    )0x0) {
          lerp<tinyusdz::value::normal3h>
                    ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      *)&local_48,a_54,b_43,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100043:
        a_41 = Value::
               as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                         (a,false);
        b_32 = Value::
               as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                         (b,false);
        if (b_32 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )0x0 &&
            a_41 != (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )0x0) {
          lerp<tinyusdz::value::normal3f>
                    ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)&local_48,a_41,b_32,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100044:
        a_32 = Value::
               as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                         (a,false);
        b_28 = Value::
               as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                         (b,false);
        if (b_28 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *
                    )0x0 &&
            a_32 != (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *
                    )0x0) {
          lerp<tinyusdz::value::normal3d>
                    ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      *)&local_48,a_32,b_28,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100045:
        a_49 = Value::
               as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                         (a,false);
        b_38 = Value::
               as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                         (b,false);
        if (b_38 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *
                    )0x0 &&
            a_49 != (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *
                    )0x0) {
          lerp<tinyusdz::value::vector3h>
                    ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      *)&local_48,a_49,b_38,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100046:
        a_25 = Value::
               as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                         (a,false);
        b_23 = Value::
               as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                         (b,false);
        if (b_23 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *
                    )0x0 &&
            a_25 != (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *
                    )0x0) {
          lerp<tinyusdz::value::vector3f>
                    ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)&local_48,a_25,b_23,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100047:
        a_30 = Value::
               as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                         (a,false);
        b_27 = Value::
               as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                         (b,false);
        if (b_27 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *
                    )0x0 &&
            a_30 != (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *
                    )0x0) {
          lerp<tinyusdz::value::vector3d>
                    ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      *)&local_48,a_30,b_27,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x100049:
        a_42 = Value::
               as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                         (a,false);
        b_33 = Value::
               as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                         (b,false);
        if (b_33 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                     *)0x0 &&
            a_42 != (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord2h>
                    ((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      *)&local_48,a_42,b_33,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10004a:
        a_26 = Value::
               as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                         (a,false);
        b_24 = Value::
               as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                         (b,false);
        if (b_24 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                     *)0x0 &&
            a_26 != (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord2f>
                    ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      *)&local_48,a_26,b_24,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
      }
      goto LAB_002a313c;
    }
LAB_002a2e42:
    switch(uVar6) {
    case 0x4b:
      ptVar40 = Value::as<tinyusdz::value::texcoord2d>(a,false);
      ptVar41 = Value::as<tinyusdz::value::texcoord2d>(b,false);
      if (ptVar41 == (texcoord2d *)0x0 || ptVar40 == (texcoord2d *)0x0) goto LAB_002a313c;
      dVar2 = dt * ptVar41->t + (1.0 - dt) * ptVar40->t;
      local_88._8_4_ = SUB84(dVar2,0);
      local_88._0_8_ = dt * ptVar41->s + (1.0 - dt) * ptVar40->s;
      local_88._12_4_ = (float)((ulong)dVar2 >> 0x20);
      Value::operator=((Value *)&local_60,(texcoord2d *)local_88);
      break;
    case 0x4c:
      a_57 = Value::as<tinyusdz::value::texcoord3h>(a,false);
      b_46 = Value::as<tinyusdz::value::texcoord3h>(b,false);
      if (b_46 == (texcoord3h *)0x0 || a_57 == (texcoord3h *)0x0) goto LAB_002a313c;
      tVar15 = lerp<tinyusdz::value::texcoord3h>(a_57,b_46,dt);
      local_88._0_2_ = tVar15.s.value;
      local_88._2_2_ = tVar15.t.value;
      local_88._4_2_ = tVar15.r.value;
      Value::operator=((Value *)&local_60,(texcoord3h *)local_88);
      break;
    case 0x4d:
      a_55 = Value::as<tinyusdz::value::texcoord3f>(a,false);
      b_44 = Value::as<tinyusdz::value::texcoord3f>(b,false);
      if (b_44 == (texcoord3f *)0x0 || a_55 == (texcoord3f *)0x0) goto LAB_002a313c;
      tVar50 = lerp<tinyusdz::value::texcoord3f>(a_55,b_44,dt);
      local_88._0_4_ = tVar50.s;
      local_88._4_4_ = tVar50.t;
      local_88._8_4_ = tVar50.r;
      Value::operator=((Value *)&local_60,(texcoord3f *)local_88);
      break;
    case 0x4e:
      ptVar42 = Value::as<tinyusdz::value::texcoord3d>(a,false);
      ptVar43 = Value::as<tinyusdz::value::texcoord3d>(b,false);
      if (ptVar43 == (texcoord3d *)0x0 || ptVar42 == (texcoord3d *)0x0) goto LAB_002a313c;
      dVar2 = 1.0 - dt;
      local_78 = (vtable_type *)(ptVar43->r * dt + ptVar42->r * dVar2);
      local_88._8_8_ = dt * ptVar43->t + dVar2 * ptVar42->t;
      local_88._0_8_ = dt * ptVar43->s + dVar2 * ptVar42->s;
      linb::any::operator=((any *)&local_60,(texcoord3d *)local_88);
      break;
    default:
      switch(uVar6) {
      case 0x10004b:
        a_23 = Value::
               as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                         (a,false);
        b_21 = Value::
               as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                         (b,false);
        if (b_21 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                     *)0x0 &&
            a_23 != (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord2d>
                    ((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)&local_48,a_23,b_21,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)local_88);
LAB_002a2e18:
          if ((void *)local_88._0_8_ != (void *)0x0) {
            operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
          }
          goto LAB_002a2e2d;
        }
        break;
      case 0x10004c:
        a_59 = Value::
               as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                         (a,false);
        b_48 = Value::
               as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                         (b,false);
        if (b_48 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                     *)0x0 &&
            a_59 != (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord3h>
                    ((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)&local_48,a_59,b_48,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10004d:
        a_56 = Value::
               as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                         (a,false);
        b_45 = Value::
               as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                         (b,false);
        if (b_45 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                     *)0x0 &&
            a_56 != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord3f>
                    ((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)&local_48,a_56,b_45,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      case 0x10004e:
        a_58 = Value::
               as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                         (a,false);
        b_47 = Value::
               as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                         (b,false);
        if (b_47 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                     *)0x0 &&
            a_58 != (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                     *)0x0) {
          lerp<tinyusdz::value::texcoord3d>
                    ((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)&local_48,a_58,b_47,dt);
          local_88._8_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_88._0_8_ =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78 = (vtable_type *)
                     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          linb::any::operator=
                    ((any *)&local_60,
                     (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)local_88);
          goto LAB_002a2e18;
        }
        break;
      default:
        bVar4 = false;
        goto LAB_002a314c;
      }
LAB_002a313c:
      bVar4 = false;
      goto LAB_002a313e;
    }
    goto LAB_002a2e2d;
  }
  lVar44 = (long)&switchD_002a13e9::switchdataD_003aae48 +
           (long)(int)(&switchD_002a13e9::switchdataD_003aae48)[uVar6 - 0xe];
  switch(uVar6) {
  case 0xe:
    bVar4 = false;
    a_00 = Value::as<tinyusdz::value::half>(a,false);
    b_00 = Value::as<tinyusdz::value::half>(b,false);
    if (b_00 != (half *)0x0 && a_00 != (half *)0x0) {
      hVar5 = lerp<tinyusdz::value::half>(a_00,b_00,dt);
      local_78 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::half>()::table;
      local_88._0_2_ = hVar5.value;
      linb::any::swap((any *)local_88,(any *)&local_60);
      if (local_78 != (vtable_type *)0x0) {
        (*local_78->destroy)((storage_union *)local_88);
      }
      break;
    }
    goto LAB_002a313e;
  default:
    goto LAB_002a2e42;
  case 0x11:
    a_08 = Value::as<std::array<tinyusdz::value::half,2ul>>(a,false);
    b_06 = Value::as<std::array<tinyusdz::value::half,2ul>>(b,false);
    if (b_06 == (array<tinyusdz::value::half,_2UL> *)0x0 ||
        a_08 == (array<tinyusdz::value::half,_2UL> *)0x0) goto LAB_002a313c;
    hVar8 = lerp<std::array<tinyusdz::value::half,2ul>>(a_08,b_06,dt);
    local_88._0_2_ = hVar8._M_elems[0].value;
    local_88._2_2_ = hVar8._M_elems[1].value;
    linb::any::operator=((any *)&local_60,(array<tinyusdz::value::half,_2UL> *)local_88);
    break;
  case 0x12:
    a_09 = Value::as<std::array<tinyusdz::value::half,3ul>>(a,false);
    b_07 = Value::as<std::array<tinyusdz::value::half,3ul>>(b,false);
    if (b_07 == (array<tinyusdz::value::half,_3UL> *)0x0 ||
        a_09 == (array<tinyusdz::value::half,_3UL> *)0x0) goto LAB_002a313c;
    hVar10 = lerp<std::array<tinyusdz::value::half,3ul>>(a_09,b_07,dt);
    local_88._0_2_ = hVar10._M_elems[0].value;
    local_88._2_2_ = hVar10._M_elems[1].value;
    local_88._4_2_ = hVar10._M_elems[2].value;
    Value::operator=((Value *)&local_60,(array<tinyusdz::value::half,_3UL> *)local_88);
    break;
  case 0x13:
    a_05 = Value::as<std::array<tinyusdz::value::half,4ul>>(a,false);
    b_05 = Value::as<std::array<tinyusdz::value::half,4ul>>(b,false);
    if (b_05 == (array<tinyusdz::value::half,_4UL> *)0x0 ||
        a_05 == (array<tinyusdz::value::half,_4UL> *)0x0) goto LAB_002a313c;
    hVar24 = lerp<std::array<tinyusdz::value::half,4ul>>(a_05,b_05,dt);
    local_88._0_2_ = hVar24._M_elems[0].value;
    local_88._2_2_ = hVar24._M_elems[1].value;
    local_88._4_2_ = hVar24._M_elems[2].value;
    local_88._6_2_ = hVar24._M_elems[3].value;
    linb::any::operator=((any *)&local_60,(array<tinyusdz::value::half,_4UL> *)local_88);
    break;
  case 0x28:
    pfVar32 = Value::as<float>(a,false);
    pfVar33 = Value::as<float>(b,false);
    if (pfVar33 == (float *)0x0 || pfVar32 == (float *)0x0) goto LAB_002a313c;
    local_88._0_4_ = (float)(1.0 - dt) * *pfVar32 + (float)dt * *pfVar33;
    linb::any::operator=((any *)&local_60,(float *)local_88);
    break;
  case 0x29:
    paVar27 = Value::as<std::array<float,2ul>>(a,false);
    paVar28 = Value::as<std::array<float,2ul>>(b,false);
    auVar3 = local_88;
    if (paVar28 == (array<float,_2UL> *)0x0 || paVar27 == (array<float,_2UL> *)0x0)
    goto LAB_002a313c;
    local_88._4_4_ =
         (float)dt * (float)((ulong)*(undefined8 *)paVar28->_M_elems >> 0x20) +
         (float)(1.0 - dt) * (float)((ulong)*(undefined8 *)paVar27->_M_elems >> 0x20);
    local_88._0_4_ =
         (float)dt * (float)*(undefined8 *)paVar28->_M_elems +
         (float)(1.0 - dt) * (float)*(undefined8 *)paVar27->_M_elems;
    local_88._8_8_ = auVar3._8_8_;
    linb::any::operator=((any *)&local_60,(array<float,_2UL> *)local_88);
    break;
  case 0x2a:
    a_15 = Value::as<std::array<float,3ul>>(a,false);
    b_13 = Value::as<std::array<float,3ul>>(b,false);
    if (b_13 == (array<float,_3UL> *)0x0 || a_15 == (array<float,_3UL> *)0x0) goto LAB_002a313c;
    fVar48 = lerp<std::array<float,3ul>>(a_15,b_13,dt);
    local_88._0_4_ = fVar48._M_elems[0];
    local_88._4_4_ = fVar48._M_elems[1];
    local_88._8_4_ = fVar48._M_elems[2];
    Value::operator=((Value *)&local_60,(array<float,_3UL> *)local_88);
    break;
  case 0x2b:
    a_12 = Value::as<std::array<float,4ul>>(a,false);
    b_10 = Value::as<std::array<float,4ul>>(b,false);
    if (b_10 == (array<float,_4UL> *)0x0 || a_12 == (array<float,_4UL> *)0x0) goto LAB_002a313c;
    local_88 = (undefined1  [16])lerp<std::array<float,4ul>>(a_12,b_10,dt);
    Value::operator=((Value *)&local_60,(array<float,_4UL> *)local_88);
    break;
  case 0x2c:
    pdVar34 = Value::as<double>(a,false);
    pdVar35 = Value::as<double>(b,false);
    if (pdVar35 == (double *)0x0 || pdVar34 == (double *)0x0) goto LAB_002a313c;
    local_88._0_8_ = (1.0 - dt) * *pdVar34 + dt * *pdVar35;
    linb::any::operator=((any *)&local_60,(double *)local_88);
    break;
  case 0x2d:
    paVar20 = Value::as<std::array<double,2ul>>(a,false);
    paVar21 = Value::as<std::array<double,2ul>>(b,false);
    if (paVar21 == (array<double,_2UL> *)0x0 || paVar20 == (array<double,_2UL> *)0x0)
    goto LAB_002a313c;
    dVar2 = dt * paVar21->_M_elems[1] + (1.0 - dt) * paVar20->_M_elems[1];
    local_88._8_4_ = SUB84(dVar2,0);
    local_88._0_8_ = dt * paVar21->_M_elems[0] + (1.0 - dt) * paVar20->_M_elems[0];
    local_88._12_4_ = (float)((ulong)dVar2 >> 0x20);
    Value::operator=((Value *)&local_60,(array<double,_2UL> *)local_88);
    break;
  case 0x2e:
    paVar29 = Value::as<std::array<double,3ul>>(a,false);
    paVar30 = Value::as<std::array<double,3ul>>(b,false);
    if (paVar30 == (array<double,_3UL> *)0x0 || paVar29 == (array<double,_3UL> *)0x0)
    goto LAB_002a313c;
    dVar2 = 1.0 - dt;
    local_78 = (vtable_type *)(paVar30->_M_elems[2] * dt + paVar29->_M_elems[2] * dVar2);
    local_88._8_8_ = dt * paVar30->_M_elems[1] + dVar2 * paVar29->_M_elems[1];
    local_88._0_8_ = dt * paVar30->_M_elems[0] + dVar2 * paVar29->_M_elems[0];
    linb::any::operator=((any *)&local_60,(array<double,_3UL> *)local_88);
    break;
  case 0x2f:
    ptVar36 = (tinyusdz *)Value::as<std::array<double,4ul>>(a,false);
    a_07 = Value::as<std::array<double,4ul>>(b,false);
    if (a_07 == (array<double,_4UL> *)0x0 || ptVar36 == (tinyusdz *)0x0) goto LAB_002a313c;
    lerp<std::array<double,4ul>>
              ((double4 *)local_88,ptVar36,a_07,
               (double4 *)CONCAT71((int7)((ulong)lVar44 >> 8),ptVar36 == (tinyusdz *)0x0),dt);
    linb::any::operator=((any *)&local_60,(double4 *)local_88);
    break;
  case 0x30:
    this = Value::as<tinyusdz::value::quath>(a,false);
    a_06 = Value::as<tinyusdz::value::quath>(b,false);
    bVar4 = a_06 == (quath *)0x0 || this == (quath *)0x0;
    if (bVar4) goto LAB_002a313c;
    qVar31 = lerp<tinyusdz::value::quath>
                       ((tinyusdz *)this,a_06,
                        (quath *)CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar4),dt);
    hVar10 = qVar31.imag._M_elems;
    local_88._0_2_ = hVar10._M_elems[0].value;
    local_88._2_2_ = hVar10._M_elems[1].value;
    local_88._4_2_ = hVar10._M_elems[2].value;
    local_88._6_2_ = qVar31.real.value;
    linb::any::operator=((any *)&local_60,(quath *)local_88);
    break;
  case 0x31:
    a_03 = Value::as<tinyusdz::value::quatf>(a,false);
    b_03 = Value::as<tinyusdz::value::quatf>(b,false);
    if (b_03 == (quatf *)0x0 || a_03 == (quatf *)0x0) goto LAB_002a313c;
    local_88 = (undefined1  [16])slerp(a_03,b_03,(float)dt);
    Value::operator=((Value *)&local_60,(quatf *)local_88);
    break;
  case 0x32:
    a_16 = Value::as<tinyusdz::value::quatd>(a,false);
    b_14 = Value::as<tinyusdz::value::quatd>(b,false);
    if (b_14 == (quatd *)0x0 || a_16 == (quatd *)0x0) goto LAB_002a313c;
    slerp((quatd *)local_88,a_16,b_14,dt);
    linb::any::operator=((any *)&local_60,(quatd *)local_88);
    break;
  case 0x39:
    a_20 = Value::as<tinyusdz::value::color3h>(a,false);
    b_18 = Value::as<tinyusdz::value::color3h>(b,false);
    if (b_18 == (color3h *)0x0 || a_20 == (color3h *)0x0) goto LAB_002a313c;
    cVar13 = lerp<tinyusdz::value::color3h>(a_20,b_18,dt);
    local_88._0_2_ = cVar13.r.value;
    local_88._2_2_ = cVar13.g.value;
    local_88._4_2_ = cVar13.b.value;
    Value::operator=((Value *)&local_60,(color3h *)local_88);
    break;
  case 0x3a:
    a_21 = Value::as<tinyusdz::value::color3f>(a,false);
    b_19 = Value::as<tinyusdz::value::color3f>(b,false);
    if (b_19 == (color3f *)0x0 || a_21 == (color3f *)0x0) goto LAB_002a313c;
    cVar49 = lerp<tinyusdz::value::color3f>(a_21,b_19,dt);
    local_88._0_4_ = cVar49.r;
    local_88._4_4_ = cVar49.g;
    local_88._8_4_ = cVar49.b;
    Value::operator=((Value *)&local_60,(color3f *)local_88);
    break;
  case 0x3b:
    pcVar37 = Value::as<tinyusdz::value::color3d>(a,false);
    pcVar38 = Value::as<tinyusdz::value::color3d>(b,false);
    if (pcVar38 == (color3d *)0x0 || pcVar37 == (color3d *)0x0) goto LAB_002a313c;
    dVar2 = 1.0 - dt;
    local_78 = (vtable_type *)(pcVar38->b * dt + pcVar37->b * dVar2);
    local_88._8_8_ = dt * pcVar38->g + dVar2 * pcVar37->g;
    local_88._0_8_ = dt * pcVar38->r + dVar2 * pcVar37->r;
    linb::any::operator=((any *)&local_60,(color3d *)local_88);
    break;
  case 0x3c:
    a_19 = Value::as<tinyusdz::value::color4h>(a,false);
    b_17 = Value::as<tinyusdz::value::color4h>(b,false);
    if (b_17 == (color4h *)0x0 || a_19 == (color4h *)0x0) goto LAB_002a313c;
    cVar39 = lerp<tinyusdz::value::color4h>(a_19,b_17,dt);
    local_88._0_2_ = cVar39.r.value;
    local_88._2_2_ = cVar39.g.value;
    local_88._4_2_ = cVar39.b.value;
    local_88._6_2_ = cVar39.a.value;
    linb::any::operator=((any *)&local_60,(color4h *)local_88);
    break;
  case 0x3d:
    a_04 = Value::as<tinyusdz::value::color4f>(a,false);
    b_04 = Value::as<tinyusdz::value::color4f>(b,false);
    if (b_04 == (color4f *)0x0 || a_04 == (color4f *)0x0) goto LAB_002a313c;
    local_88 = (undefined1  [16])lerp<tinyusdz::value::color4f>(a_04,b_04,dt);
    Value::operator=((Value *)&local_60,(color4f *)local_88);
    break;
  case 0x3e:
    a_18 = Value::as<tinyusdz::value::color4d>(a,false);
    b_16 = Value::as<tinyusdz::value::color4d>(b,false);
    if (b_16 == (color4d *)0x0 || a_18 == (color4d *)0x0) goto LAB_002a313c;
    lerp<tinyusdz::value::color4d>((color4d *)local_88,a_18,b_16,dt);
    linb::any::operator=((any *)&local_60,(color4d *)local_88);
    break;
  case 0x3f:
    a_13 = Value::as<tinyusdz::value::point3h>(a,false);
    b_11 = Value::as<tinyusdz::value::point3h>(b,false);
    if (b_11 == (point3h *)0x0 || a_13 == (point3h *)0x0) goto LAB_002a313c;
    pVar11 = lerp<tinyusdz::value::point3h>(a_13,b_11,dt);
    local_88._0_2_ = pVar11.x.value;
    local_88._2_2_ = pVar11.y.value;
    local_88._4_2_ = pVar11.z.value;
    Value::operator=((Value *)&local_60,(point3h *)local_88);
    break;
  case 0x40:
    a_14 = Value::as<tinyusdz::value::point3f>(a,false);
    b_12 = Value::as<tinyusdz::value::point3f>(b,false);
    if (b_12 == (point3f *)0x0 || a_14 == (point3f *)0x0) goto LAB_002a313c;
    pVar47 = lerp<tinyusdz::value::point3f>(a_14,b_12,dt);
    local_88._0_4_ = pVar47.x;
    local_88._4_4_ = pVar47.y;
    local_88._8_4_ = pVar47.z;
    Value::operator=((Value *)&local_60,(point3f *)local_88);
    break;
  case 0x41:
    ppVar16 = Value::as<tinyusdz::value::point3d>(a,false);
    ppVar17 = Value::as<tinyusdz::value::point3d>(b,false);
    if (ppVar17 == (point3d *)0x0 || ppVar16 == (point3d *)0x0) goto LAB_002a313c;
    dVar2 = 1.0 - dt;
    local_78 = (vtable_type *)(ppVar17->z * dt + ppVar16->z * dVar2);
    local_88._8_8_ = dt * ppVar17->y + dVar2 * ppVar16->y;
    local_88._0_8_ = dt * ppVar17->x + dVar2 * ppVar16->x;
    linb::any::operator=((any *)&local_60,(point3d *)local_88);
    break;
  case 0x42:
    a_22 = Value::as<tinyusdz::value::normal3h>(a,false);
    b_20 = Value::as<tinyusdz::value::normal3h>(b,false);
    if (b_20 == (normal3h *)0x0 || a_22 == (normal3h *)0x0) goto LAB_002a313c;
    nVar14 = lerp<tinyusdz::value::normal3h>(a_22,b_20,dt);
    local_88._0_2_ = nVar14.x.value;
    local_88._2_2_ = nVar14.y.value;
    local_88._4_2_ = nVar14.z.value;
    Value::operator=((Value *)&local_60,(normal3h *)local_88);
    break;
  case 0x43:
    a_10 = Value::as<tinyusdz::value::normal3f>(a,false);
    b_08 = Value::as<tinyusdz::value::normal3f>(b,false);
    if (b_08 == (normal3f *)0x0 || a_10 == (normal3f *)0x0) goto LAB_002a313c;
    nVar46 = lerp<tinyusdz::value::normal3f>(a_10,b_08,dt);
    local_88._0_4_ = nVar46.x;
    local_88._4_4_ = nVar46.y;
    local_88._8_4_ = nVar46.z;
    Value::operator=((Value *)&local_60,(normal3f *)local_88);
    break;
  case 0x44:
    pnVar25 = Value::as<tinyusdz::value::normal3d>(a,false);
    pnVar26 = Value::as<tinyusdz::value::normal3d>(b,false);
    if (pnVar26 == (normal3d *)0x0 || pnVar25 == (normal3d *)0x0) goto LAB_002a313c;
    dVar2 = 1.0 - dt;
    local_78 = (vtable_type *)(pnVar26->z * dt + pnVar25->z * dVar2);
    local_88._8_8_ = dt * pnVar26->y + dVar2 * pnVar25->y;
    local_88._0_8_ = dt * pnVar26->x + dVar2 * pnVar25->x;
    linb::any::operator=((any *)&local_60,(normal3d *)local_88);
    break;
  case 0x45:
    a_17 = Value::as<tinyusdz::value::vector3h>(a,false);
    b_15 = Value::as<tinyusdz::value::vector3h>(b,false);
    if (b_15 == (vector3h *)0x0 || a_17 == (vector3h *)0x0) goto LAB_002a313c;
    vVar12 = lerp<tinyusdz::value::vector3h>(a_17,b_15,dt);
    local_88._0_2_ = vVar12.x.value;
    local_88._2_2_ = vVar12.y.value;
    local_88._4_2_ = vVar12.z.value;
    Value::operator=((Value *)&local_60,(vector3h *)local_88);
    break;
  case 0x46:
    a_02 = Value::as<tinyusdz::value::vector3f>(a,false);
    b_02 = Value::as<tinyusdz::value::vector3f>(b,false);
    if (b_02 == (vector3f *)0x0 || a_02 == (vector3f *)0x0) goto LAB_002a313c;
    vVar45 = lerp<tinyusdz::value::vector3f>(a_02,b_02,dt);
    local_88._0_4_ = vVar45.x;
    local_88._4_4_ = vVar45.y;
    local_88._8_4_ = vVar45.z;
    Value::operator=((Value *)&local_60,(vector3f *)local_88);
    break;
  case 0x47:
    pvVar22 = Value::as<tinyusdz::value::vector3d>(a,false);
    pvVar23 = Value::as<tinyusdz::value::vector3d>(b,false);
    if (pvVar23 == (vector3d *)0x0 || pvVar22 == (vector3d *)0x0) goto LAB_002a313c;
    dVar2 = 1.0 - dt;
    local_78 = (vtable_type *)(pvVar23->z * dt + pvVar22->z * dVar2);
    local_88._8_8_ = dt * pvVar23->y + dVar2 * pvVar22->y;
    local_88._0_8_ = dt * pvVar23->x + dVar2 * pvVar22->x;
    linb::any::operator=((any *)&local_60,(vector3d *)local_88);
    break;
  case 0x49:
    a_11 = Value::as<tinyusdz::value::texcoord2h>(a,false);
    b_09 = Value::as<tinyusdz::value::texcoord2h>(b,false);
    if (b_09 == (texcoord2h *)0x0 || a_11 == (texcoord2h *)0x0) goto LAB_002a313c;
    tVar9 = lerp<tinyusdz::value::texcoord2h>(a_11,b_09,dt);
    local_88._0_2_ = tVar9.s.value;
    local_88._2_2_ = tVar9.t.value;
    linb::any::operator=((any *)&local_60,(texcoord2h *)local_88);
    break;
  case 0x4a:
    ptVar18 = Value::as<tinyusdz::value::texcoord2f>(a,false);
    ptVar19 = Value::as<tinyusdz::value::texcoord2f>(b,false);
    auVar3 = local_88;
    if (ptVar19 == (texcoord2f *)0x0 || ptVar18 == (texcoord2f *)0x0) goto LAB_002a313c;
    local_88._4_4_ = (float)dt * (*ptVar19).t + (float)(1.0 - dt) * (*ptVar18).t;
    local_88._0_4_ = (float)dt * (*ptVar19).s + (float)(1.0 - dt) * (*ptVar18).s;
    local_88._8_8_ = auVar3._8_8_;
    linb::any::operator=((any *)&local_60,(texcoord2f *)local_88);
  }
LAB_002a2e2d:
  linb::any::operator=(&dst->v_,(any *)&local_60);
  bVar4 = true;
LAB_002a313e:
  if (local_50 != (undefined8 *)0x0) {
LAB_002a314c:
    (*(code *)local_50[4])(&local_60);
  }
  return bVar4;
}

Assistant:

bool Lerp(const value::Value &a, const value::Value &b, double dt, value::Value *dst) {
  if (!dst) {
    return false;
  }

  if (a.type_id() != b.type_id()) {
    return false;
  }

  uint32_t tyid = a.type_id();

  if (!IsLerpSupportedType(tyid)) {
    return false;
  }

  bool ok{false};
  value::Value result;

#define DO_LERP(__ty) \
  if (tyid == value::TypeTraits<__ty>::type_id()) { \
    const __ty *v0 = a.as<__ty>(); \
    const __ty *v1 = b.as<__ty>(); \
    __ty c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else if (tyid == value::TypeTraits<std::vector<__ty>>::type_id()) { \
    const std::vector<__ty> *v0 = a.as<std::vector<__ty>>(); \
    const std::vector<__ty> *v1 = b.as<std::vector<__ty>>(); \
    std::vector<__ty> c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else

  DO_LERP(value::half)
  DO_LERP(value::half2)
  DO_LERP(value::half3)
  DO_LERP(value::half4)
  DO_LERP(float)
  DO_LERP(value::float2)
  DO_LERP(value::float3)
  DO_LERP(value::float4)
  DO_LERP(double)
  DO_LERP(value::double2)
  DO_LERP(value::double3)
  DO_LERP(value::double4)
  DO_LERP(value::quath)
  DO_LERP(value::quatf)
  DO_LERP(value::quatd)
  DO_LERP(value::color3h)
  DO_LERP(value::color3f)
  DO_LERP(value::color3d)
  DO_LERP(value::color4h)
  DO_LERP(value::color4f)
  DO_LERP(value::color4d)
  DO_LERP(value::point3h)
  DO_LERP(value::point3f)
  DO_LERP(value::point3d)
  DO_LERP(value::normal3h)
  DO_LERP(value::normal3f)
  DO_LERP(value::normal3d)
  DO_LERP(value::vector3h)
  DO_LERP(value::vector3f)
  DO_LERP(value::vector3d)
  DO_LERP(value::texcoord2h)
  DO_LERP(value::texcoord2f)
  DO_LERP(value::texcoord2d)
  DO_LERP(value::texcoord3h)
  DO_LERP(value::texcoord3f)
  DO_LERP(value::texcoord3d)
  {
    DCOUT("TODO: type " << GetTypeName(tyid));
  }

#undef DO_LERP

  if (ok) {
    (*dst) = result;
  }

  return ok;
}